

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

void __thiscall
PhyloTree::PhyloTree(PhyloTree *this,PhyloTree *other,vector<int,_std::allocator<int>_> *missing)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  __node_base _Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> index_end;
  ulong uVar13;
  size_type num_bits;
  __node_base _Var14;
  pointer pbVar15;
  ulong uVar16;
  ulong uVar17;
  mapped_type mVar18;
  pointer this_00;
  long lVar19;
  double dVar20;
  EdgeInfo info;
  bitset_t pruned;
  vector<double,_std::allocator<double>_> pruned_lengths;
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
  hashmap;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  name_indices;
  undefined1 local_200 [8];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  int local_1d8;
  bool local_1d4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  bitset_t *local_1b8;
  PhyloTree *local_1b0;
  _func_int **local_1a8;
  string local_1a0;
  vector<double,_std::allocator<double>_> *local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_178;
  pointer local_170;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_168;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Stack_160;
  undefined8 local_158;
  vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_140;
  bitset_t local_108;
  bitset_t local_e8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  bitset_t local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_148 = &(this->newick).field_2;
  (this->newick)._M_dataplus._M_p = (pointer)local_148;
  (this->newick)._M_string_length = 0;
  (this->newick).field_2._M_local_buf[0] = '\0';
  local_150 = (vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)&this->edges;
  local_178 = &this->leaf2NumMap;
  local_180 = &this->leafEdgeLengths;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = 0;
  local_168._M_current = (double *)0x0;
  _Stack_160._M_current = (double *)0x0;
  local_1b8 = (bitset_t *)missing;
  local_1b0 = this;
  Tools::
  prune_container<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (missing->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (missing->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_178);
  index_end._M_current =
       (((_Vector_base<int,_std::allocator<int>_> *)&local_1b8->m_bits)->_M_impl).
       super__Vector_impl_data._M_finish;
  Tools::
  prune_container<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (other->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (other->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (((_Vector_base<int,_std::allocator<int>_> *)&local_1b8->m_bits)->_M_impl).
             super__Vector_impl_data._M_start,index_end,
             (vector<double,_std::allocator<double>_> *)&local_168);
  local_200 = (undefined1  [8])0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_180,
             (long)(local_1b0->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_1b0->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type_conflict *)local_200);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DEBUG - pruned_names",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  Tools::
  vector_print<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((local_1b0->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (local_1b0->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DEBUG - pruned_lengths",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  Tools::
  vector_print<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (local_168,_Stack_160);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pbVar15 = (local_1b0->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_1b0->leaf2NumMap).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar15) {
    lVar19 = 0;
    mVar18 = 0;
    do {
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_68,(key_type *)((long)&(pbVar15->_M_dataplus)._M_p + lVar19));
      *pmVar5 = mVar18;
      mVar18 = mVar18 + 1;
      pbVar15 = (local_1b0->leaf2NumMap).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar19 = lVar19 + 0x20;
    } while (mVar18 < (ulong)((long)(local_1b0->leaf2NumMap).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5)
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DEBUG - name_indices",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  for (_Var1._M_nxt = local_68._M_before_begin._M_nxt; _Var1._M_nxt != (_Hash_node_base *)0x0;
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)_Var1._M_nxt[1]._M_nxt,
                        (long)_Var1._M_nxt[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  local_140._M_buckets = &local_140._M_single_bucket;
  local_140._M_bucket_count = 1;
  local_140._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_140._M_element_count = 0;
  local_140._M_rehash_policy._M_max_load_factor = 1.0;
  local_140._M_rehash_policy._M_next_resize = 0;
  local_140._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (other->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_170 = (other->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_170) {
    local_1a8 = (_func_int **)((ulong)local_1a8 & 0xffffffff00000000);
    do {
      Bipartition::getPartition
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,
                 &this_00->super_Bipartition);
      Tools::prune_bitset<std::vector<int,std::allocator<int>>>
                ((bitset_t *)&local_1a0,(Tools *)local_200,local_1b8,
                 (vector<int,_std::allocator<int>_> *)index_end._M_current);
      bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_200);
      if (!bVar3) goto LAB_0014a2ca;
      if (local_200 != (undefined1  [8])0x0) {
        operator_delete((void *)local_200);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"DEBUG - edge = ",0xf);
      (**(this_00->super_Bipartition)._vptr_Bipartition)
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,this_00)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_200,
                          (long)local_1f8.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," pruned = ",10);
      pbVar7 = boost::operator<<(poVar6,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                         *)&local_1a0);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar7 + -0x18) + (char)pbVar7);
      std::ostream::put((char)pbVar7);
      std::ostream::flush();
      if (local_200 != (undefined1  [8])(local_200 + 0x10)) {
        operator_delete((void *)local_200);
      }
      iVar8 = std::
              _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_140,(key_type *)&local_1a0);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
          ._M_cur == (__node_type *)0x0) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0);
        iVar8 = std::
                _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_140,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_200);
        bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_200);
        if (!bVar3) goto LAB_0014a2ca;
        if (local_200 != (undefined1  [8])0x0) {
          operator_delete((void *)local_200);
        }
        if (iVar8.
            super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_200 = (undefined1  [8])0x0;
          local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)(local_200 + 0x18);
          local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_1d8 = 0;
          local_1d4 = false;
          local_200 = (undefined1  [8])PhyloTreeEdge::getLength(this_00);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_e8.m_bits,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0);
          local_e8.m_num_bits = local_1a0.field_2._8_8_;
          bVar3 = Tools::is_leaf(&local_e8);
          bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants(&local_e8);
          if (!bVar4) goto LAB_0014a2ca;
          if (local_e8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (bVar3) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_108.m_bits,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0);
            local_108.m_num_bits = local_1a0.field_2._8_8_;
            sVar10 = Tools::leaf_index_nothrow(&local_108);
            bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_108);
            if (!bVar3) goto LAB_0014a2ca;
            if (local_108.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            std::__cxx11::string::_M_assign((string *)(local_200 + 8));
            local_200 = (undefined1  [8])(local_168._M_current[sVar10] + (double)local_200);
            local_1d4 = true;
          }
          else {
            local_1d8 = (int)local_1a8;
            local_1a8 = (_func_int **)CONCAT44(local_1a8._4_4_,(int)local_1a8 + 1);
          }
          pmVar9 = std::__detail::
                   _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_140,(key_type *)&local_1a0);
          pmVar9->length = (double)local_200;
          std::__cxx11::string::_M_assign((string *)&pmVar9->name);
          index_end._M_current = (int *)(local_200 + 0x10);
          pmVar9->leaf = local_1d4;
          pmVar9->id = local_1d8;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"DEBUG - adding hashmap[",0x17);
          pbVar7 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)&local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>(pbVar7,"] = {",5);
          poVar6 = std::ostream::_M_insert<double>((double)local_200);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_1f8.m_bits.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1f8.m_bits.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
          poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
          std::ostream::put('0');
          std::ostream::flush();
          if (local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)(local_200 + 0x18)) {
            operator_delete(local_1f8.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0);
          pmVar9 = std::__detail::
                   _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_140,
                                (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                local_200);
          bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)local_200);
          if (!bVar3) goto LAB_0014a2ca;
          if (local_200 != (undefined1  [8])0x0) {
            operator_delete((void *)local_200);
          }
          dVar20 = PhyloTreeEdge::getLength(this_00);
          pmVar9->length = dVar20 + pmVar9->length;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"DEBUG - altering hashmap[",0x19);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0);
          pbVar7 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)local_200);
          std::__ostream_insert<char,std::char_traits<char>>(pbVar7,"] = {",5);
          poVar6 = std::ostream::_M_insert<double>(pmVar9->length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(pmVar9->name)._M_dataplus._M_p,(pmVar9->name)._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pmVar9->id);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
          poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"} (complement)",0xe);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)local_200);
          if (!bVar3) goto LAB_0014a2ca;
          if (local_200 != (undefined1  [8])0x0) {
            operator_delete((void *)local_200);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
          std::ostream::put('0');
          std::ostream::flush();
        }
      }
      else {
        pmVar9 = std::__detail::
                 _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_140,(key_type *)&local_1a0);
        dVar20 = PhyloTreeEdge::getLength(this_00);
        pmVar9->length = dVar20 + pmVar9->length;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DEBUG - altering hashmap[",0x19);
        pbVar7 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar7,"] = {",5);
        poVar6 = std::ostream::_M_insert<double>(pmVar9->length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(pmVar9->name)._M_dataplus._M_p,(pmVar9->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pmVar9->id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
      }
      bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_1a0);
      if (!bVar3) goto LAB_0014a2ca;
      if (local_1a0._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_170);
  }
  lVar19 = (long)(local_1b0->leaf2NumMap).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_1b0->leaf2NumMap).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar19 != 0) {
    num_bits = lVar19 >> 5;
    local_1b8 = (bitset_t *)(num_bits + (num_bits == 0));
    lVar19 = -1;
    do {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0,
                 num_bits,0,(allocator<unsigned_long> *)local_200);
      *(ulong *)(local_1a0._M_dataplus._M_p + (num_bits + lVar19 >> 6) * 8) =
           *(ulong *)(local_1a0._M_dataplus._M_p + (num_bits + lVar19 >> 6) * 8) |
           1L << ((byte)(num_bits + lVar19) & 0x3f);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_88.m_bits,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0);
      local_88.m_num_bits = local_1a0.field_2._8_8_;
      sVar10 = Tools::leaf_index_nothrow(&local_88);
      bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_88);
      if (!bVar3) goto LAB_0014a2ca;
      if (local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar8 = std::
              _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_140,(key_type *)&local_1a0);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
          ._M_cur == (__node_type *)0x0) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                  (&local_a8,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a0);
        iVar8 = std::
                _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_140,&local_a8);
        bVar3 = iVar8.
                super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
                ._M_cur == (__node_type *)0x0;
        bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_a8);
        if (!bVar4) goto LAB_0014a2ca;
        if (local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else {
        bVar3 = false;
      }
      if (bVar3) {
        local_200 = (undefined1  [8])0x0;
        local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(local_200 + 0x18);
        local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_1d8 = 0;
        local_1d4 = false;
        std::__cxx11::string::_M_assign((string *)(local_200 + 8));
        local_200 = (undefined1  [8])local_168._M_current[sVar10];
        local_1d4 = true;
        pmVar9 = std::__detail::
                 _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_140,(key_type *)&local_1a0);
        pmVar9->length = (double)local_200;
        std::__cxx11::string::_M_assign((string *)&pmVar9->name);
        pmVar9->leaf = local_1d4;
        pmVar9->id = local_1d8;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DEBUG - adding leaf hashmap[",0x1c);
        pbVar7 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar7,"] = {",5);
        poVar6 = std::ostream::_M_insert<double>((double)local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_1f8.m_bits.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1f8.m_bits.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        if (local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)(local_200 + 0x18)) {
          operator_delete(local_1f8.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_1a0);
      if (!bVar3) goto LAB_0014a2ca;
      if (local_1a0._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      lVar11 = (long)&(((_Vector_base<int,_std::allocator<int>_> *)&local_1b8->m_bits)->_M_impl).
                      super__Vector_impl_data._M_start + lVar19;
      lVar19 = lVar19 + -1;
    } while (lVar11 != 0);
  }
  if (local_140._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    local_170 = (pointer)&PTR_toString_abi_cxx11__001bdcd8;
    local_1a8 = (_func_int **)&PTR_toString_abi_cxx11__001bdba8;
    _Var14._M_nxt = local_140._M_before_begin._M_nxt;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"DEBUG - hashmap key: ",0x15);
      b = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(_Var14._M_nxt + 1);
      pbVar7 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,b);
      std::__ostream_insert<char,std::char_traits<char>>(pbVar7,", value: {",10);
      poVar6 = std::ostream::_M_insert<double>((double)_Var14._M_nxt[5]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)_Var14._M_nxt[6]._M_nxt,(long)_Var14._M_nxt[7]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)&_Var14._M_nxt[10]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (*(char *)((long)&_Var14._M_nxt[10]._M_nxt + 4) == '\x01') {
        local_1b8 = (bitset_t *)_Var14._M_nxt[5]._M_nxt;
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_68,(key_type *)(_Var14._M_nxt + 6));
        (local_180->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[*pmVar5] = (double)local_1b8;
      }
      else {
        bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all(b);
        if (!bVar3) {
          p_Var2 = _Var14._M_nxt[1]._M_nxt;
          lVar19 = (long)_Var14._M_nxt[2]._M_nxt - (long)p_Var2;
          bVar3 = lVar19 != 0;
          if (lVar19 == 0) {
LAB_0014a0d1:
            if (!bVar3) goto LAB_0014a0ec;
          }
          else {
            uVar12 = lVar19 >> 3;
            uVar13 = uVar12 + (uVar12 == 0);
            if (p_Var2->_M_nxt == (_Hash_node_base *)0x0) {
              uVar16 = 0;
              do {
                uVar17 = uVar13;
                if (uVar13 - 1 == uVar16) break;
                uVar17 = uVar16 + 1;
                lVar19 = uVar16 + 1;
                uVar16 = uVar17;
              } while (p_Var2[lVar19]._M_nxt == (_Hash_node_base *)0x0);
              bVar3 = uVar17 < uVar12;
              goto LAB_0014a0d1;
            }
          }
          std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
          emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const&,double&,int&>
                    (local_150,b,(double *)(_Var14._M_nxt + 5),(int *)(_Var14._M_nxt + 10));
        }
LAB_0014a0ec:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DEBUG - PhyloTreeEdge check",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_c8.m_bits,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)b);
        local_c8.m_num_bits = (size_type)_Var14._M_nxt[4]._M_nxt;
        PhyloTreeEdge::PhyloTreeEdge
                  ((PhyloTreeEdge *)local_200,&local_c8,(double)_Var14._M_nxt[5]._M_nxt,
                   *(int *)&_Var14._M_nxt[10]._M_nxt);
        bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_c8);
        if (!bVar3) {
LAB_0014a2ca:
          __assert_fail("m_check_invariants()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                        ,0x279,
                        "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
        if (local_c8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        PhyloTreeEdge::toString_abi_cxx11_(&local_1a0,(PhyloTreeEdge *)local_200);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_1a0._M_dataplus._M_p,
                            local_1a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        dVar20 = PhyloTreeEdge::getLength((PhyloTreeEdge *)local_200);
        poVar6 = std::ostream::_M_insert<double>(dVar20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        local_200 = (undefined1  [8])local_170;
        if (local_1c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_pi);
        }
        local_200 = (undefined1  [8])local_1a8;
        bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   (local_200 + 8));
        if (!bVar3) goto LAB_0014a2ca;
        if (local_1f8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_140);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_168._M_current != (double *)0x0) {
    operator_delete(local_168._M_current);
  }
  return;
}

Assistant:

PhyloTree::PhyloTree(const PhyloTree& other, const vector<int>& missing)
{
    vector<double> pruned_lengths;  // temp store relevant edge lengths from other tree

    // TODO: combine these into a single loop
    Tools::prune_container(other.leaf2NumMap.begin(), other.leaf2NumMap.end(),
            missing.begin(), missing.end(), std::back_inserter(this->leaf2NumMap)); // fill pruned leaf2NumMap
    Tools::prune_container(other.leafEdgeLengths.begin(), other.leafEdgeLengths.end(),
            missing.begin(), missing.end(), std::back_inserter(pruned_lengths)); // fill temp lengths store

    this->leafEdgeLengths.resize(this->leaf2NumMap.size(), 0); // initialise leaf lengths vector

#ifdef DEBUGPRINT
    cout << "DEBUG - pruned_names" << endl;
    Tools::vector_print(this->leaf2NumMap.begin(), this->leaf2NumMap.end());

    cout << "DEBUG - pruned_lengths" << endl;
    Tools::vector_print(pruned_lengths.begin(), pruned_lengths.end());
    cout << "DEBUG end" << endl;
#endif

    std::unordered_map<string, size_t> name_indices;
    for (size_t i = 0; i<this->leaf2NumMap.size(); i++) {
        name_indices[this->leaf2NumMap[i]] = i;
    }
#ifdef DEBUGPRINT
    cout << "DEBUG - name_indices" << endl;
    for (auto& item: name_indices) {
        cout << item.first << " " << item.second << endl;
    }
    cout << "DEBUG end" << endl;
#endif

    std::unordered_map<bitset_t, EdgeInfo, BitsetHash> hashmap;
    int inner_edge_counter = 0;
    for (auto& edge: other.edges) {
        auto pruned = Tools::prune_bitset(edge.getPartition(), missing);

#ifdef DEBUGPRINT
        auto edge_copy = &edge;
        cout << "DEBUG - edge = " << const_cast<PhyloTreeEdge*>(edge_copy)->toString() << " pruned = " << pruned
                << endl;
#endif


        if (hashmap.find(pruned)==hashmap.end()) {
            if (hashmap.find(~pruned)==hashmap.end()) {
                EdgeInfo info;
                info.length = edge.getLength();
                if (Tools::is_leaf(pruned)) {
                    size_t ix = Tools::leaf_index_nothrow(pruned);
                    info.name = this->leaf2NumMap[ix];
                    info.length += pruned_lengths[ix];
                    info.leaf = true;
                }
                else {
                    info.id = inner_edge_counter++;
                }
                hashmap[pruned] = info;
#ifdef DEBUGPRINT
                cout << "DEBUG - adding hashmap[" << pruned << "] = {" << info.length << ", " << info.name
                        << ", " << info.id << ", " << info.leaf << "}" << endl;
                cout << "DEBUG end" << endl;
#endif
            }
            else {
                auto& info = hashmap[~pruned];
                info.length += edge.getLength();
#ifdef DEBUGPRINT
                cout << "DEBUG - altering hashmap[" << ~pruned << "] = {" << info.length << ", " << info.name
                        << ", " << info.id << ", " << info.leaf << "} (complement)" << endl;
                cout << "DEBUG end" << endl;
#endif
            }
        }
        else {
            auto& info = hashmap[pruned];
            info.length += edge.getLength();
#ifdef DEBUGPRINT
            cout << "DEBUG - altering hashmap[" << pruned << "] = {" << info.length << ", " << info.name
                    << ", " << info.id << ", " << info.leaf << "}" << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }
    // Add remaining leaves
    size_t size = this->leaf2NumMap.size();
    for (size_t i=0; i < size; ++i) {
        bitset_t leaf_split(size);
        leaf_split[size - i - 1] = true;
        size_t index = Tools::leaf_index_nothrow(leaf_split);
        if (hashmap.find(leaf_split)==hashmap.end() && hashmap.find(~leaf_split)==hashmap.end()) {
            EdgeInfo info;
            info.name = this->leaf2NumMap[index];
            info.length = pruned_lengths[index];
            info.leaf = true;
            hashmap[leaf_split] = info;
#ifdef DEBUGPRINT
            cout << "DEBUG - adding leaf hashmap[" << leaf_split << "] = {" << info.length << ", " << info.name
                    << ", " << info.id << ", " << info.leaf << "}" << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }

    // All info to build this PhyloTree is in the hashmap
    for (auto& item : hashmap) {
#ifdef DEBUGPRINT
        cout << "DEBUG - hashmap key: " << item.first << ", value: {" << item.second.length << ", " << item.second.name
                << ", " << item.second.id << ", " << item.second.leaf << "}" << endl;
#endif
        if (item.second.leaf) {
            this->leafEdgeLengths[name_indices[item.second.name]] = item.second.length;
        }
        else {
            if (!item.first.all() && !item.first.none()) {
                this->edges.emplace_back(item.first, item.second.length, item.second.id);
            }
#ifdef DEBUGPRINT
            cout << "DEBUG - PhyloTreeEdge check" << endl;
            PhyloTreeEdge check(item.first, item.second.length, item.second.id);
            cout << check.toString() << " " << check.getLength() << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }
}